

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void KYBER_generate_key_external_entropy
               (uint8_t *out_encoded_public_key,KYBER_private_key *out_private_key,uint8_t *entropy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  vector *pvVar4;
  uint8_t *in;
  public_key *pub;
  int iVar5;
  scalar *psVar6;
  int i;
  long lVar7;
  long lVar8;
  uint8_t counter;
  uint8_t *local_898;
  uint8_t *local_890;
  scalar *local_888;
  public_key *local_880;
  uint8_t hashed [64];
  CBB cbb;
  vector error;
  
  local_898 = entropy;
  local_890 = out_encoded_public_key;
  hash_g(hashed,entropy,0x20);
  *(undefined8 *)((long)&out_private_key->opaque + 0x610) = hashed._16_8_;
  *(undefined8 *)((long)&out_private_key->opaque + 0x618) = hashed._24_8_;
  *(undefined8 *)((long)&out_private_key->opaque + 0x600) = hashed._0_8_;
  *(undefined8 *)((long)&out_private_key->opaque + 0x608) = hashed._8_8_;
  matrix_expand((matrix *)((long)&out_private_key->opaque + 0x640),hashed);
  counter = '\0';
  psVar6 = (scalar *)((long)&out_private_key->opaque + 0x1840);
  vector_generate_secret_eta_2((vector *)psVar6,&counter,hashed + 0x20);
  local_888 = psVar6;
  vector_ntt((vector *)psVar6);
  vector_generate_secret_eta_2(&error,&counter,hashed + 0x20);
  vector_ntt(&error);
  memset(out_private_key,0,0x600);
  local_880 = (public_key *)out_private_key;
  for (lVar7 = 0; pub = local_880, lVar7 != 3; lVar7 = lVar7 + 1) {
    pvVar4 = &local_880->t;
    psVar6 = local_888;
    for (lVar8 = 0x640; lVar8 != 0x1840; lVar8 = lVar8 + 0x600) {
      scalar_mult((scalar *)&cbb,(scalar *)((long)&out_private_key->opaque + lVar8),psVar6);
      scalar_add(pvVar4->v + lVar7,(scalar *)&cbb);
      psVar6 = psVar6 + 1;
    }
    out_private_key = (KYBER_private_key *)((long)&out_private_key->opaque + 0x200);
  }
  vector_add(&local_880->t,&error);
  in = local_890;
  CBB_init_fixed(&cbb,local_890,0x4a0);
  iVar5 = kyber_marshal_public_key(&cbb,pub);
  if (iVar5 != 0) {
    hash_h(pub->public_key_hash,in,0x4a0);
    uVar1 = *(undefined8 *)(local_898 + 0x20);
    uVar2 = *(undefined8 *)(local_898 + 0x28);
    uVar3 = *(undefined8 *)(local_898 + 0x38);
    *(undefined8 *)(pub[1].rho + 0x10) = *(undefined8 *)(local_898 + 0x30);
    *(undefined8 *)(pub[1].rho + 0x18) = uVar3;
    *(undefined8 *)pub[1].rho = uVar1;
    *(undefined8 *)(pub[1].rho + 8) = uVar2;
    return;
  }
  abort();
}

Assistant:

void KYBER_generate_key_external_entropy(
    uint8_t out_encoded_public_key[KYBER_PUBLIC_KEY_BYTES],
    struct KYBER_private_key *out_private_key,
    const uint8_t entropy[KYBER_GENERATE_KEY_ENTROPY]) {
  struct private_key *priv = private_key_from_external(out_private_key);
  uint8_t hashed[64];
  hash_g(hashed, entropy, 32);
  const uint8_t *const rho = hashed;
  const uint8_t *const sigma = hashed + 32;
  // rho is public.
  CONSTTIME_DECLASSIFY(rho, 32);
  OPENSSL_memcpy(priv->pub.rho, hashed, sizeof(priv->pub.rho));
  matrix_expand(&priv->pub.m, rho);
  uint8_t counter = 0;
  vector_generate_secret_eta_2(&priv->s, &counter, sigma);
  vector_ntt(&priv->s);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, sigma);
  vector_ntt(&error);
  matrix_mult_transpose(&priv->pub.t, &priv->pub.m, &priv->s);
  vector_add(&priv->pub.t, &error);
  // t is part of the public key and thus is public.
  CONSTTIME_DECLASSIFY(&priv->pub.t, sizeof(priv->pub.t));

  CBB cbb;
  CBB_init_fixed(&cbb, out_encoded_public_key, KYBER_PUBLIC_KEY_BYTES);
  if (!kyber_marshal_public_key(&cbb, &priv->pub)) {
    abort();
  }

  hash_h(priv->pub.public_key_hash, out_encoded_public_key,
         KYBER_PUBLIC_KEY_BYTES);
  OPENSSL_memcpy(priv->fo_failure_secret, entropy + 32, 32);
}